

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginLV2export.cpp
# Opt level: O1

void addAttribute(String *text,char *attribute,char **values,uint indent,bool endInDot)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  
  if ((*values != (char *)0x0) && (sVar2 = strlen(attribute), *values != (char *)0x0)) {
    uVar5 = 0;
    ppcVar4 = values;
    do {
      iVar7 = 4;
      do {
        DISTRHO::String::operator+=(text," ");
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      if ((int)uVar5 == 0) {
        DISTRHO::String::operator+=(text,attribute);
      }
      else if (sVar2 != 0) {
        uVar8 = 1;
        do {
          DISTRHO::String::operator+=(text," ");
          bVar1 = uVar8 < sVar2;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar1);
      }
      DISTRHO::String::operator+=(text," ");
      pcVar6 = *ppcVar4;
      pcVar3 = strstr(pcVar6,"://");
      if ((pcVar3 != (char *)0x0) || (iVar7 = strncmp(pcVar6,"urn:",4), iVar7 == 0)) {
        DISTRHO::String::operator+=(text,"<");
        DISTRHO::String::operator+=(text,*ppcVar4);
        pcVar6 = ">";
      }
      DISTRHO::String::operator+=(text,pcVar6);
      uVar5 = (ulong)((int)uVar5 + 1);
      ppcVar4 = values + uVar5;
      pcVar6 = " ,\n";
      if (*ppcVar4 == (char *)0x0) {
        pcVar6 = " ;\n\n";
      }
      DISTRHO::String::operator+=(text,pcVar6);
    } while (*ppcVar4 != (char *)0x0);
  }
  return;
}

Assistant:

static void addAttribute(DISTRHO_NAMESPACE::String& text,
                         const char* const attribute,
                         const char* const values[],
                         const uint indent,
                         const bool endInDot = false)
{
    if (values[0] == nullptr)
    {
        if (endInDot)
        {
            bool found;
            const size_t index = text.rfind(';', &found);
            if (found) text[index] = '.';
        }
        return;
    }

    const size_t attributeLength = std::strlen(attribute);

    for (uint i = 0; values[i] != nullptr; ++i)
    {
        for (uint j = 0; j < indent; ++j)
            text += " ";

        if (i == 0)
        {
            text += attribute;
        }
        else
        {
            for (uint j = 0; j < attributeLength; ++j)
                text += " ";
        }

        text += " ";

        const bool isUrl = std::strstr(values[i], "://") != nullptr || std::strncmp(values[i], "urn:", 4) == 0;
        if (isUrl) text += "<";
        text += values[i];
        if (isUrl) text += ">";
        text += values[i + 1] ? " ,\n" : (endInDot ? " .\n\n" : " ;\n\n");
    }
}